

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O1

SSTableDataEntry * __thiscall
DiskTableNode::getEntry(SSTableDataEntry *__return_storage_ptr__,DiskTableNode *this,longlong key)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  
  if ((this->index == (IndexMap *)0x0) ||
     ((this->index->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    loadIndexFilter(this);
  }
  p_Var1 = &(this->index->_M_t)._M_impl.super__Rb_tree_header;
  p_Var3 = (this->index->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(long *)(p_Var3 + 1) < key]) {
    if (key <= *(long *)(p_Var3 + 1)) {
      p_Var2 = p_Var3;
    }
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) && (p_Var3 = p_Var2, key < *(long *)(p_Var2 + 1))) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    SSTableDataEntry::SSTableDataEntry(__return_storage_ptr__,false,0,0,"");
  }
  else {
    SSTable::getEntry(__return_storage_ptr__,this->_sstable,(longlong)p_Var3[1]._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

SSTableDataEntry DiskTableNode::getEntry(long long key) {
    auto *i = getIndex();
    auto p = i->find(key);
    if (p == i->end()) {
        return SSTableDataEntry{false, 0, 0, ""};
    }
    auto offset = p->second;
    return _sstable->getEntry(offset);
}